

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O0

void __thiscall
TPZNonLinMultGridAnalysis::SmoothingSolution
          (TPZNonLinMultGridAnalysis *this,REAL tol,int numiter,TPZMaterial *matbase,
          TPZLinearAnalysis *an,TPZFMatrix<double> *rhs)

{
  ostream *poVar1;
  void *pvVar2;
  TPZSolutionMatrix *this_00;
  TPZLinearAnalysis *in_RCX;
  long in_RDX;
  int in_ESI;
  TPZAnalysis *in_RDI;
  double in_XMM0_Qa;
  TPZFMatrix<double> *myrhs;
  TPZFMatrix<double> rhsim1;
  REAL normsol;
  int iter;
  TPZCompMesh *anmesh;
  TPZMaterialT<double> *mat;
  TPZSolutionMatrix *in_stack_fffffffffffffdc8;
  TPZSolutionMatrix *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  TPZFMatrix<double> *pTVar3;
  code *CompMesh;
  TPZNonLinMultGridAnalysis *in_stack_fffffffffffffe30;
  TPZNonLinMultGridAnalysis *this_01;
  TPZFMatrix<double> *this_02;
  TPZNonLinMultGridAnalysis *local_1c0;
  double local_80;
  undefined1 local_68 [104];
  
  local_68._64_8_ = in_RCX;
  local_68._84_4_ = in_ESI;
  local_68._88_8_ = in_XMM0_Qa;
  if (in_RDX == 0) {
    local_1c0 = (TPZNonLinMultGridAnalysis *)0x0;
  }
  else {
    local_1c0 = (TPZNonLinMultGridAnalysis *)
                __dynamic_cast(in_RDX,&TPZMaterial::typeinfo,&TPZMaterialT<double>::typeinfo,0);
  }
  local_68._48_8_ = local_1c0;
  if ((int)local_68._84_4_ < 2) {
    local_68._84_4_ = 2;
  }
  local_68._40_8_ = TPZAnalysis::Mesh((TPZAnalysis *)local_68._64_8_);
  local_68._36_4_ = 0;
  pTVar3 = (TPZFMatrix<double> *)&std::cout;
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1874e99);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_68._36_4_);
  CompMesh = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  TPZAnalysis::Solution((TPZAnalysis *)local_68._64_8_);
  TPZSolutionMatrix::Zero(in_stack_fffffffffffffdc8);
  SetDeltaTime(in_stack_fffffffffffffe30,(TPZCompMesh *)CompMesh,(TPZMaterial *)pTVar3);
  (*(((TPZAnalysis *)local_68._64_8_)->super_TPZSavable)._vptr_TPZSavable[0xb])
            (local_68._64_8_,pTVar3);
  poVar1 = std::operator<<((ostream *)pTVar3,
                           "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = ");
  local_68._36_4_ = local_68._36_4_ + 1;
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_68._36_4_);
  std::ostream::operator<<(pvVar2,CompMesh);
  (*(((TPZAnalysis *)local_68._64_8_)->super_TPZSavable)._vptr_TPZSavable[0xc])();
  this_02 = (TPZFMatrix<double> *)local_68;
  this_01 = (TPZNonLinMultGridAnalysis *)local_68._48_8_;
  std::function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)>::function
            ((function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  (*(this_01->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x14])
            (this_01,this_02,0xffffffff);
  std::function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)>::~function
            ((function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *)0x1c4c8d5);
  TPZAnalysis::Solution(in_RDI);
  local_80 = ::Norm(in_stack_fffffffffffffdc8);
  TPZLinearAnalysis::Rhs((TPZLinearAnalysis *)local_68._64_8_);
  TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_fffffffffffffdd0);
  TPZFMatrix<double>::TPZFMatrix
            (pTVar3,(TPZFMatrix<double> *)
                    CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  while ((int)local_68._36_4_ < (int)local_68._84_4_ && local_80 < (double)local_68._88_8_) {
    TPZAnalysis::Solution((TPZAnalysis *)local_68._64_8_);
    TPZSolutionMatrix::Zero(in_stack_fffffffffffffdc8);
    SetDeltaTime(this_01,(TPZCompMesh *)CompMesh,(TPZMaterial *)pTVar3);
    (*(((TPZAnalysis *)local_68._64_8_)->super_TPZSavable)._vptr_TPZSavable[0xb])
              (local_68._64_8_,&std::cout);
    (*(((TPZAnalysis *)local_68._64_8_)->super_TPZSavable)._vptr_TPZSavable[0xc])();
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = ");
    local_68._36_4_ = local_68._36_4_ + 1;
    pvVar2 = (void *)std::ostream::operator<<(poVar1,local_68._36_4_);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    TPZAnalysis::Solution(in_RDI);
    local_80 = ::Norm(in_stack_fffffffffffffdc8);
  }
  if ((int)local_68._36_4_ < (int)local_68._84_4_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
                            );
    poVar1 = std::operator<<(poVar1," due the great norm of the solution, norm solution = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,local_80);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  (*(((TPZAnalysis *)local_68._64_8_)->super_TPZSavable)._vptr_TPZSavable[0xc])();
  this_00 = TPZLinearAnalysis::Rhs((TPZLinearAnalysis *)local_68._64_8_);
  pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
  TPZFMatrix<double>::operator-(this_02,(TPZFMatrix<double> *)this_01);
  TPZFMatrix<double>::operator=((TPZFMatrix<double> *)this_00,pTVar3);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c4cb82);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c4cb8f);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::SmoothingSolution(REAL tol,int numiter,TPZMaterial * matbase,TPZLinearAnalysis &an,TPZFMatrix<STATE> &rhs){
	auto *mat =
		dynamic_cast<TPZMaterialT<STATE>*>(matbase);
	//pelo menos duas iteracoes para calcular o residuo
	if(numiter <= 1) numiter = 2;
	TPZCompMesh *anmesh = an.Mesh();
	int iter = 0;
	cout << "PZAnalysis::SmoothingSolutionTest beginning of the iterative process iterac� = " << iter << endl;
	an.Solution().Zero();
	SetDeltaTime(anmesh,mat);
	an.Run();
	cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = " << ++iter << endl;
	an.LoadSolution();
	mat->SetForcingFunction(nullptr,-1);
	REAL normsol = Norm(Solution());
	TPZFMatrix<STATE> rhsim1 = an.Rhs();
	
	while(iter < numiter && normsol < tol) {
		
		an.Solution().Zero();
		SetDeltaTime(anmesh,mat);
		//    rhsim1 = an.Rhs();//guarda o anterior res�uo
		an.Run();
		an.LoadSolution();
		cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = " << ++iter << endl;
		normsol = Norm(Solution());
	}
	if(iter < numiter){
		cout << "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
		<< " due the great norm of the solution, norm solution = " << normsol << endl;
	}
	an.LoadSolution();
	//TODOCOMPLEX
	TPZFMatrix<STATE> &myrhs = an.Rhs();
	rhs = myrhs - rhsim1;//ltimo residuo - res�uo anterior
}